

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gecko.cpp
# Opt level: O0

void __thiscall MyProgress::endphase(MyProgress *this,Graph *graph,bool show)

{
  byte in_DL;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 8) != 0) && ((in_DL & 1) != 0)) {
    Gecko::Drawing::draw(*(Graph **)(in_RDI + 8));
  }
  return;
}

Assistant:

void endphase(const Graph* graph, bool show) const
  {
#if VERBOSE
    if (show)
      std::cerr << " f=" << fixed << setw(12) << std::setprecision(6) << graph->cost();
    std::cerr << std::endl;
#endif
    if (drawing && show)
      drawing->draw(graph);
  }